

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

uint fmt::v5::internal::
     parse_nonnegative_int<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&>
               (wchar_t **begin,wchar_t *end,
               specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
               *eh)

{
  bool bVar1;
  uint uVar2;
  uint big;
  uint max_int;
  uint value;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
  *eh_local;
  wchar_t *end_local;
  wchar_t **begin_local;
  
  bVar1 = false;
  if ((*begin != end) && (bVar1 = false, L'/' < **begin)) {
    bVar1 = **begin < L':';
  }
  if (!bVar1) {
    __assert_fail("begin != end && \'0\' <= *begin && *begin <= \'9\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/format.h"
                  ,0x5b0,
                  "unsigned int fmt::internal::parse_nonnegative_int(const Char *&, const Char *, ErrorHandler &&) [Char = wchar_t, ErrorHandler = fmt::internal::specs_checker<fmt::internal::specs_handler<fmt::basic_format_context<std::back_insert_iterator<fmt::internal::basic_buffer<wchar_t>>, wchar_t>>> &]"
                 );
  }
  if (**begin == L'0') {
    *begin = *begin + 1;
    begin_local._4_4_ = 0;
  }
  else {
    big = 0;
    uVar2 = std::numeric_limits<int>::max();
    do {
      if (uVar2 / 10 < big) {
        big = uVar2 + 1;
        break;
      }
      big = big * 10 + **begin + L'\xffffffd0';
      *begin = *begin + 1;
      bVar1 = false;
      if ((*begin != end) && (bVar1 = false, L'/' < **begin)) {
        bVar1 = **begin < L':';
      }
    } while (bVar1);
    if (uVar2 < big) {
      specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
      ::on_error(&eh->
                  super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                 ,"number is too big");
    }
    begin_local._4_4_ = big;
  }
  return begin_local._4_4_;
}

Assistant:

FMT_CONSTEXPR unsigned parse_nonnegative_int(
    const Char *&begin, const Char *end, ErrorHandler &&eh) {
  assert(begin != end && '0' <= *begin && *begin <= '9');
  if (*begin == '0') {
    ++begin;
    return 0;
  }
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  unsigned max_int = (std::numeric_limits<int>::max)();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int)
    eh.on_error("number is too big");
  return value;
}